

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::loadgulsummaryxref(summarycalc *this)

{
  char *pcVar1;
  long *plVar2;
  FILE *__stream;
  size_t sVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  long lVar5;
  gulsummaryxref s;
  string file;
  undefined8 local_80;
  long local_78;
  long local_70;
  long lStack_68;
  undefined1 local_60 [32];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = local_60 + 0x10;
  local_60._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"input/gulsummaryxref.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)local_60);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_40,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar2[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar2;
    }
    local_78 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  __stream = fopen((char *)local_60._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    init_c_to_s(this);
    sVar3 = fread(&local_80,0xc,1,__stream);
    if ((int)sVar3 != 0) {
      do {
        lVar5 = (long)(int)local_78;
        if (9 < lVar5) {
          loadgulsummaryxref();
          goto LAB_00103259;
        }
        if (this->fout[lVar5] != (FILE *)0x0) {
          if (local_80._4_4_ < this->min_summary_id_[lVar5]) {
            this->min_summary_id_[lVar5] = local_80._4_4_;
          }
          if (this->max_summary_id_[lVar5] < local_80._4_4_) {
            this->max_summary_id_[lVar5] = local_80._4_4_;
          }
          (this->co_to_s_[lVar5]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[(int)local_80] = local_80._4_4_;
        }
        sVar3 = fread(&local_80,0xc,1,__stream);
      } while ((int)sVar3 != 0);
    }
    fclose(__stream);
    if ((char *)local_60._0_8_ != pcVar1) {
      operator_delete((void *)local_60._0_8_);
    }
    return;
  }
LAB_00103259:
  loadgulsummaryxref((summarycalc *)local_60);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if ((char *)local_60._0_8_ != pcVar1) {
    operator_delete((void *)local_60._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void summarycalc::loadgulsummaryxref()
{
	std::string file = GULSUMMARYXREF_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, file.c_str());
		::exit(-1);
	}

	init_c_to_s();
	gulsummaryxref s;
	int i = (int)fread(&s, sizeof(gulsummaryxref), 1, fin);
	while (i != 0) {
		if (s.summaryset_id > 9) {
			fprintf(stderr, "FATAL: %s: Invalid summaryset id  %d found in %s\n", __func__, s.summaryset_id, file.c_str());
			::exit(-1);
		}
		if (fout[s.summaryset_id] != nullptr) {
			if (s.summary_id < min_summary_id_[s.summaryset_id]) min_summary_id_[s.summaryset_id] = s.summary_id;
			if (s.summary_id > max_summary_id_[s.summaryset_id]) max_summary_id_[s.summaryset_id] = s.summary_id;
			(*co_to_s_[s.summaryset_id])[s.coverage_id] = s.summary_id ;
		}
		i = (int) fread(&s, sizeof(gulsummaryxref), 1, fin);
	}

	fclose(fin);
}